

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  int iVar1;
  item *piVar2;
  int iVar3;
  size_type sVar4;
  int *piVar5;
  longdouble *plVar6;
  ulong uVar7;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>_>
  _Var8;
  solver_failure *this_00;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  
  if (r_size < 4) {
LAB_005c8b3b:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
              ();
LAB_005c8b40:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
              ();
  }
  else {
    if (bk_max < bk_min) goto LAB_005c8b40;
    *(int *)(this + 0x74) = bk_min;
    *(int *)(this + 0x78) = bk_max;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
              *)(this + 0x20),(ulong)(uint)r_size);
    iVar3 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
    if ((char)iVar3 == '\0') goto LAB_005c8b4a;
    sVar4 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x70) = sVar4;
    if (sVar4 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      lVar11 = *(long *)(this + 0x20);
      piVar5 = &((reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                ._M_head_impl)->f;
      lVar12 = 0;
      do {
        *(longdouble *)(lVar11 + lVar12) = ((rc_data *)(piVar5 + -5))->value;
        *(int *)(lVar11 + 0x28 + lVar12) = piVar5[-1];
        iVar3 = *piVar5;
        *(int *)(lVar11 + 0x24 + lVar12) = iVar3;
        iVar13 = -iVar3;
        if (0 < iVar3) {
          iVar13 = iVar3;
        }
        *(int *)(lVar11 + 0x20 + lVar12) = iVar13;
        *(undefined4 *)(lVar11 + 0x2c + lVar12) = 0;
        piVar5 = piVar5 + 8;
        lVar12 = lVar12 + 0x30;
      } while ((ulong)(uint)r_size * 0x30 != lVar12);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar11 = *(long *)(this + 0x20);
      lVar12 = *(long *)(this + 0x28);
      if (lVar11 != lVar12) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar11,lVar12,
                   (int)LZCOUNT((lVar12 - lVar11 >> 4) * -0x5555555555555555) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar11,lVar12);
      }
      lVar11 = *(long *)(this + 0x20);
      lVar12 = *(long *)(this + 0x28);
      lVar10 = (lVar12 - lVar11 >> 4) * -0x5555555555555555;
      if (lVar12 != lVar11) {
        iVar3 = *(int *)(this + 0x74);
        iVar13 = *(int *)(this + 0x78);
        piVar5 = (int *)(lVar11 + 0x24);
        lVar17 = lVar10;
        do {
          if (*piVar5 < 0) {
            iVar1 = piVar5[-1];
            iVar3 = iVar3 + iVar1;
            *(int *)(this + 0x74) = iVar3;
            iVar13 = iVar13 + iVar1;
            *(int *)(this + 0x78) = iVar13;
          }
          piVar5 = piVar5 + 0xc;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      *(unkbyte10 *)(lVar12 + -0x20) = *(unkbyte10 *)(lVar12 + -0x30);
      iVar3 = (int)lVar10;
      if (1 < iVar3) {
        uVar7 = (ulong)(iVar3 - 2);
        plVar6 = (longdouble *)(lVar11 + uVar7 * 0x30);
        lVar11 = uVar7 + 1;
        do {
          plVar6[1] = *plVar6 + plVar6[4];
          plVar6 = plVar6 + -3;
          lVar12 = lVar11 + -1;
          bVar18 = 0 < lVar11;
          lVar11 = lVar12;
        } while (lVar12 != 0 && bVar18);
      }
      if (*(int *)(this + 0x78) == *(int *)(this + 0x74)) {
        branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *)this);
      }
      lVar11 = *(long *)(this + 0x20);
      lVar12 = *(long *)(this + 0x28);
      uVar7 = (lVar12 - lVar11 >> 4) * -0x5555555555555555;
      if ((int)uVar7 != 0) {
        uVar9 = *(uint *)(this + 0x70);
        lVar10 = *(long *)this;
        lVar17 = *(long *)(this + 8);
        lVar15 = 0;
        uVar16 = uVar9;
        do {
          if (*(int *)(lVar11 + 0x24 + lVar15) < 1) {
            if ((ulong)(lVar17 - lVar10) <= (ulong)uVar16) goto LAB_005c8b36;
            bVar18 = *(char *)(lVar10 + (ulong)uVar16) == '\0';
          }
          else {
            if ((ulong)(lVar17 - lVar10) <= (ulong)uVar9) {
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                        ();
LAB_005c8b36:
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                        ();
              goto LAB_005c8b3b;
            }
            bVar18 = *(char *)(lVar10 + (ulong)uVar9) != '\0';
          }
          *(uint *)(lVar11 + 0x2c + lVar15) = (uint)bVar18;
          uVar16 = uVar16 + 1;
          uVar9 = uVar9 + 1;
          lVar15 = lVar15 + 0x30;
        } while ((uVar7 & 0xffffffff) * 0x30 != lVar15);
      }
      if (lVar11 != lVar12) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar11,lVar12,(int)LZCOUNT(uVar7) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar11,lVar12);
      }
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                        (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
      lVar11 = *(long *)(this + 0x20);
      piVar2 = *(item **)(this + 0x28);
      lVar12 = (long)piVar2 - lVar11;
      if (lVar12 != 0) {
        lVar12 = (lVar12 >> 4) * -0x5555555555555555;
        piVar5 = (int *)(lVar11 + 0x28);
        piVar14 = &((reduced_cost->_M_t).
                    super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                   ._M_head_impl)->f;
        do {
          ((rc_data *)(piVar14 + -5))->value = *(longdouble *)(piVar5 + -10);
          piVar14[-1] = *piVar5;
          *piVar14 = piVar5[-1];
          piVar5 = piVar5 + 0xc;
          piVar14 = piVar14 + 8;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      if (_Var8._M_current == piVar2) {
        uVar9 = -(uint)(*(int *)(lVar11 + 0x2c) == 0) | r_size;
      }
      else {
        uVar9 = (int)((ulong)((long)_Var8._M_current - lVar11) >> 4) * -0x55555555 - 1;
      }
      return uVar9;
    }
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
            ();
LAB_005c8b4a:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }